

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractsocketengine.cpp
# Opt level: O2

void __thiscall QSocketEngineHandler::~QSocketEngineHandler(QSocketEngineHandler *this)

{
  Type *pTVar1;
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_socketHandlers>_> *pQVar2;
  long in_FS_OFFSET;
  QSocketEngineHandler *local_30;
  undefined1 local_28 [16];
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  this->_vptr_QSocketEngineHandler = (_func_int **)&PTR__QSocketEngineHandler_002cb550;
  pQVar2 = (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_socketHandlers>_> *)
           this;
  pTVar1 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_socketHandlers>_>::
           operator()((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_socketHandlers>_>
                       *)this);
  if (pTVar1 != (Type *)0x0) {
    local_28._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    pTVar1 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_socketHandlers>_>::
             operator()(pQVar2);
    pQVar2 = (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_socketHandlers>_> *)
             &pTVar1->mutex;
    local_28._0_8_ = pQVar2;
    QBasicMutex::lock((QBasicMutex *)pQVar2);
    local_28[8] = true;
    pTVar1 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_socketHandlers>_>::
             operator()(pQVar2);
    local_30 = this;
    QtPrivate::sequential_erase_with_copy<QList<QSocketEngineHandler*>,QSocketEngineHandler*>
              (&pTVar1->super_QList<QSocketEngineHandler_*>,&local_30);
    QMutexLocker<QMutex>::~QMutexLocker((QMutexLocker<QMutex> *)local_28);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QSocketEngineHandler::~QSocketEngineHandler()
{
    if (!socketHandlers())
        return;
    QMutexLocker locker(&socketHandlers()->mutex);
    socketHandlers()->removeAll(this);
}